

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_test.cpp
# Opt level: O0

void __thiscall Container::test_CopyStaticArray::test_method(test_CopyStaticArray *this)

{
  undefined8 uVar1;
  bool bVar2;
  uint32_t uVar3;
  uint *puVar4;
  lazy_ostream *plVar5;
  uint *puVar6;
  uint *puVar7;
  undefined1 local_1c8 [8];
  StaticArray<unsigned_int> arr4;
  basic_cstring<const_char> local_1a8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_198;
  assertion_result local_178;
  basic_cstring<const_char> local_160;
  basic_cstring<const_char> local_150;
  undefined1 local_140 [8];
  StaticArray<unsigned_int> arr3;
  basic_cstring<const_char> local_120;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_110;
  assertion_result local_f0;
  basic_cstring<const_char> local_d8;
  basic_cstring<const_char> local_c8;
  StaticArray<unsigned_int> local_b8;
  undefined4 local_a8;
  uint32_t local_a4;
  basic_cstring<const_char> local_a0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_90;
  basic_cstring<const_char> local_68;
  basic_cstring<const_char> local_58;
  undefined1 local_48 [8];
  StaticArray<unsigned_int> arr2;
  undefined1 local_28 [8];
  StaticArray<unsigned_int> arr;
  uint32_t size;
  test_CopyStaticArray *this_local;
  
  arr._12_4_ = 4;
  cont::StaticArray<unsigned_int>::StaticArray((StaticArray<unsigned_int> *)local_28,4);
  puVar4 = cont::StaticArray<unsigned_int>::operator[]((StaticArray<unsigned_int> *)local_28,0);
  *puVar4 = 1;
  puVar4 = cont::StaticArray<unsigned_int>::operator[]((StaticArray<unsigned_int> *)local_28,1);
  *puVar4 = 2;
  puVar4 = cont::StaticArray<unsigned_int>::operator[]((StaticArray<unsigned_int> *)local_28,2);
  *puVar4 = 3;
  puVar4 = cont::StaticArray<unsigned_int>::operator[]((StaticArray<unsigned_int> *)local_28,3);
  *puVar4 = 4;
  cont::StaticArray<unsigned_int>::StaticArray((StaticArray<unsigned_int> *)local_48,1);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_58,
               "/workspace/llm4binary/github/license_all_cmakelists_25/fedyura[P]esoinn_text/src/container/test/container_test.cpp"
               ,0x72);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_68);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_58,0x21,&local_68);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_90,plVar5,(char (*) [1])0x10d014);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/fedyura[P]esoinn_text/src/container/test/container_test.cpp"
               ,0x72);
    local_a4 = cont::StaticArray<unsigned_int>::size((StaticArray<unsigned_int> *)local_48);
    local_a8 = 1;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (&local_90,&local_a0,0x21,1,2,&local_a4,"arr2.size()",&local_a8,"1");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_90);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  cont::StaticArray<unsigned_int>::StaticArray(&local_b8,(StaticArray<unsigned_int> *)local_28);
  cont::StaticArray<unsigned_int>::operator=((StaticArray<unsigned_int> *)local_48,&local_b8);
  cont::StaticArray<unsigned_int>::~StaticArray(&local_b8);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/fedyura[P]esoinn_text/src/container/test/container_test.cpp"
               ,0x72);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_d8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_c8,0x24,&local_d8);
    puVar4 = cont::StaticArray<unsigned_int>::data((StaticArray<unsigned_int> *)local_28);
    puVar6 = cont::StaticArray<unsigned_int>::data((StaticArray<unsigned_int> *)local_28);
    uVar3 = cont::StaticArray<unsigned_int>::size((StaticArray<unsigned_int> *)local_28);
    puVar7 = cont::StaticArray<unsigned_int>::data((StaticArray<unsigned_int> *)local_48);
    bVar2 = std::equal<unsigned_int*,unsigned_int*>(puVar4,puVar6 + uVar3,puVar7);
    boost::test_tools::assertion_result::assertion_result(&local_f0,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_120,"std::equal(arr.data(), arr.data() + arr.size(), arr2.data())",0x3c);
    boost::unit_test::operator<<(&local_110,plVar5,&local_120);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&arr3.m_Size,
               "/workspace/llm4binary/github/license_all_cmakelists_25/fedyura[P]esoinn_text/src/container/test/container_test.cpp"
               ,0x72);
    boost::test_tools::tt_detail::report_assertion(&local_f0,&local_110,&arr3.m_Size,0x24,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_110);
    boost::test_tools::assertion_result::~assertion_result(&local_f0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  cont::StaticArray<unsigned_int>::StaticArray
            ((StaticArray<unsigned_int> *)local_140,(StaticArray<unsigned_int> *)local_28);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_150,
               "/workspace/llm4binary/github/license_all_cmakelists_25/fedyura[P]esoinn_text/src/container/test/container_test.cpp"
               ,0x72);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_160);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_150,0x27,&local_160);
    puVar4 = cont::StaticArray<unsigned_int>::data((StaticArray<unsigned_int> *)local_28);
    puVar6 = cont::StaticArray<unsigned_int>::data((StaticArray<unsigned_int> *)local_28);
    uVar3 = cont::StaticArray<unsigned_int>::size((StaticArray<unsigned_int> *)local_28);
    puVar7 = cont::StaticArray<unsigned_int>::data((StaticArray<unsigned_int> *)local_140);
    bVar2 = std::equal<unsigned_int*,unsigned_int*>(puVar4,puVar6 + uVar3,puVar7);
    boost::test_tools::assertion_result::assertion_result(&local_178,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1a8,"std::equal(arr.data(), arr.data() + arr.size(), arr3.data())",0x3c);
    boost::unit_test::operator<<(&local_198,plVar5,&local_1a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&arr4.m_Size,
               "/workspace/llm4binary/github/license_all_cmakelists_25/fedyura[P]esoinn_text/src/container/test/container_test.cpp"
               ,0x72);
    boost::test_tools::tt_detail::report_assertion(&local_178,&local_198,&arr4.m_Size,0x27,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_198);
    boost::test_tools::assertion_result::~assertion_result(&local_178);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  cont::StaticArray<unsigned_int>::StaticArray
            ((StaticArray<unsigned_int> *)local_1c8,(StaticArray<unsigned_int> *)local_28);
  cont::StaticArray<unsigned_int>::~StaticArray((StaticArray<unsigned_int> *)local_1c8);
  cont::StaticArray<unsigned_int>::~StaticArray((StaticArray<unsigned_int> *)local_140);
  cont::StaticArray<unsigned_int>::~StaticArray((StaticArray<unsigned_int> *)local_48);
  cont::StaticArray<unsigned_int>::~StaticArray((StaticArray<unsigned_int> *)local_28);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_CopyStaticArray)
{
    uint32_t size = 4;
    cont::StaticArray<uint32_t> arr(size);
    arr[0] = 1;
    arr[1] = 2;
    arr[2] = 3;
    arr[3] = 4;
    
    cont::StaticArray<uint32_t> arr2(1);
    BOOST_CHECK_EQUAL(arr2.size(), 1);
    
    arr2 = arr; 
    BOOST_CHECK(std::equal(arr.data(), arr.data() + arr.size(), arr2.data()));

    cont::StaticArray<uint32_t> arr3(arr);
    BOOST_CHECK(std::equal(arr.data(), arr.data() + arr.size(), arr3.data()));
    
    cont::StaticArray<uint32_t> arr4 = arr;
}